

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

char * stb__splitpath_raw(char *buffer,char *path,int flag)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  size_t sVar5;
  
  sVar5 = strlen(path);
  iVar3 = (int)sVar5;
  pcVar13 = (char *)0x0;
  cVar1 = *path;
  pcVar8 = path;
  while (cVar1 != '\0') {
    if (cVar1 == '\\') {
      pcVar13 = pcVar8;
    }
    if (cVar1 == '/') {
      pcVar13 = pcVar8;
    }
    pcVar6 = pcVar8 + 1;
    pcVar8 = pcVar8 + 1;
    cVar1 = *pcVar6;
  }
  uVar12 = 0xc;
  if (flag != 8) {
    uVar12 = flag;
  }
  if ((uVar12 & 7) == 0) {
LAB_0014e699:
    buffer = (char *)0x0;
  }
  else {
    iVar9 = (int)pcVar13 + 1;
    if (pcVar13 == (char *)0x0) {
      iVar9 = 0;
    }
    iVar9 = iVar9 - (int)path;
    if (pcVar13 == (char *)0x0) {
      iVar9 = 0;
    }
    pcVar6 = strrchr(path,0x2e);
    pcVar8 = (char *)0x0;
    if (pcVar13 <= pcVar6) {
      pcVar8 = pcVar6;
    }
    if (pcVar6 == (char *)0x0) {
      pcVar8 = pcVar6;
    }
    if (pcVar13 == (char *)0x0) {
      pcVar8 = pcVar6;
    }
    iVar7 = (int)pcVar8 - (int)path;
    if (pcVar8 == (char *)0x0) {
      iVar7 = iVar3;
    }
    if ((uVar12 & 1) == 0) {
      bVar2 = true;
      iVar4 = 0;
      iVar11 = iVar9;
      iVar10 = iVar7;
      if (((uVar12 & 2) != 0) || (iVar4 = 0, iVar11 = iVar7, iVar10 = iVar9, (uVar12 & 8) == 0))
      goto LAB_0014e665;
      iVar11 = (uint)(buffer[iVar7] == '.') + iVar7;
      if ((uVar12 & 4) != 0) {
        iVar10 = iVar3;
      }
    }
    else {
      bVar2 = uVar12 != 1 || iVar9 != 0;
      iVar10 = iVar9;
      if ((uVar12 & 2) != 0) {
        iVar10 = iVar7;
      }
      iVar4 = (uint)(uVar12 == 1 && iVar9 == 0) * 2;
      iVar11 = 0;
LAB_0014e665:
      if ((uVar12 & 4) != 0) {
        iVar10 = iVar3;
      }
      if ((buffer == (char *)0x0) &&
         (buffer = (char *)malloc((long)(((iVar4 + iVar10) - iVar11) + 1)), buffer == (char *)0x0))
      goto LAB_0014e699;
      if (!bVar2) {
        buffer[2] = '\0';
        buffer[0] = '.';
        buffer[1] = '/';
        return buffer;
      }
    }
    strncpy(buffer,path + iVar11,(long)(iVar10 - iVar11));
    buffer[iVar10 - iVar11] = '\0';
  }
  return buffer;
}

Assistant:

static char *stb__splitpath_raw(char *buffer, char *path, int flag)
{
   int len=0,x,y, n = (int) strlen(path), f1,f2;
   char *s = stb_strrchr2(path, '/', '\\');
   char *t = strrchr(path, '.');
   if (s && t && t < s) t = NULL;
   if (s) ++s;

   if (flag == STB_EXT_NO_PERIOD)
      flag |= STB_EXT;

   if (!(flag & (STB_PATH | STB_FILE | STB_EXT))) return NULL;

   f1 = s == NULL ? 0 : s-path; // start of filename
   f2 = t == NULL ? n : t-path; // just past end of filename

   if (flag & STB_PATH) {
      x = 0; if (f1 == 0 && flag == STB_PATH) len=2;
   } else if (flag & STB_FILE) {
      x = f1;
   } else {
      x = f2;
      if (flag & STB_EXT_NO_PERIOD)
         if (buffer[x] == '.')
            ++x;
   }

   if (flag & STB_EXT)
      y = n;
   else if (flag & STB_FILE)
      y = f2;
   else
      y = f1;

   if (buffer == NULL) {
      buffer = (char *) malloc(y-x + len + 1);
      if (!buffer) return NULL;
   }

   if (len) { strcpy(buffer, "./"); return buffer; }
   strncpy(buffer, path+x, y-x);
   buffer[y-x] = 0;
   return buffer;
}